

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

void RemoveFromLink<stTimeoutItem_t,stTimeoutItemLink_t>(stTimeoutItem_t *ap)

{
  stTimeoutItemLink_t *psVar1;
  stTimeoutItem_t *psVar2;
  stTimeoutItem_t *psVar3;
  
  psVar1 = ap->pLink;
  if (psVar1 != (stTimeoutItemLink_t *)0x0) {
    if ((psVar1->head == (stTimeoutItem_t *)0x0) ||
       (psVar2 = psVar1->tail, psVar2 == (stTimeoutItem_t *)0x0)) {
      __assert_fail("lst->head && lst->tail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abhinavabcd[P]libco/co_routine.cpp"
                    ,0x9c,
                    "void RemoveFromLink(T *) [T = stTimeoutItem_t, TLink = stTimeoutItemLink_t]");
    }
    if (psVar1->head == ap) {
      psVar3 = ap->pNext;
      psVar1->head = psVar3;
      if (psVar3 != (stTimeoutItem_t *)0x0) {
        psVar3->pPrev = (stTimeoutItem_t *)0x0;
      }
    }
    else if (ap->pPrev != (stTimeoutItem_t *)0x0) {
      ap->pPrev->pNext = ap->pNext;
    }
    psVar3 = ap->pPrev;
    if (psVar2 == ap) {
      psVar1->tail = psVar3;
      if (psVar3 != (stTimeoutItem_t *)0x0) {
        psVar3->pNext = (stTimeoutItem_t *)0x0;
      }
    }
    else {
      ap->pNext->pPrev = psVar3;
    }
    ap->pPrev = (stTimeoutItem_t *)0x0;
    ap->pNext = (stTimeoutItem_t *)0x0;
    ap->pLink = (stTimeoutItemLink_t *)0x0;
  }
  return;
}

Assistant:

void RemoveFromLink(T *ap)
{
	TLink *lst = ap->pLink;
	if(!lst) return ;
	assert( lst->head && lst->tail );

	if( ap == lst->head )
	{
		lst->head = ap->pNext;
		if(lst->head)
		{
			lst->head->pPrev = NULL;
		}
	}
	else
	{
		if(ap->pPrev)
		{
			ap->pPrev->pNext = ap->pNext;
		}
	}

	if( ap == lst->tail )
	{
		lst->tail = ap->pPrev;
		if(lst->tail)
		{
			lst->tail->pNext = NULL;
		}
	}
	else
	{
		ap->pNext->pPrev = ap->pPrev;
	}

	ap->pPrev = ap->pNext = NULL;
	ap->pLink = NULL;
}